

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::Resize
          (KeyMapBase<unsigned_long> *this,map_index_t new_num_buckets)

{
  NodeBase *pNVar1;
  map_index_t b;
  TableEntryPtr *pTVar2;
  MixingHashState MVar3;
  NodeBase *node;
  KeyMapBase<unsigned_long> *this_00;
  NodeBase local_20 [2];
  KeyMapBase<unsigned_long> *local_10;
  
  if ((this->super_UntypedMapBase).num_buckets_ == 1) {
    (this->super_UntypedMapBase).index_of_first_non_null_ = 2;
    (this->super_UntypedMapBase).num_buckets_ = 2;
    pTVar2 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,2);
    (this->super_UntypedMapBase).table_ = pTVar2;
    local_20[0].next = (NodeBase *)rdtsc();
    local_10 = this;
    MVar3 = absl::lts_20240722::hash_internal::
            HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
            combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                      ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                       (unsigned_long *)local_20,&(this->super_UntypedMapBase).table_,&local_10);
    (this->super_UntypedMapBase).seed_ = (map_index_t)MVar3.state_;
  }
  else {
    if (new_num_buckets < 2) {
      node = local_20;
      this_00 = (KeyMapBase<unsigned_long> *)(ulong)new_num_buckets;
      Resize();
      do {
        pNVar1 = node->next;
        b = BucketNumber(this_00,(ViewType)node[1].next);
        InsertUnique(this_00,b,(KeyNode *)node);
        node = pNVar1;
      } while (pNVar1 != (NodeBase *)0x0);
      return;
    }
    Resize();
  }
  return;
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = kMinTableSize;
      table_ = CreateEmptyTable(num_buckets_);
      seed_ = Seed();
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      if (internal::TableEntryIsNonEmptyList(old_table[i])) {
        TransferList(static_cast<KeyNode*>(TableEntryToNode(old_table[i])));
      } else if (internal::TableEntryIsTree(old_table[i])) {
        this->TransferTree(TableEntryToTree(old_table[i]), NodeToVariantKey);
      }
    }
    DeleteTable(old_table, old_table_size);
  }